

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O2

bool __thiscall wasm::LocalGraph::isSSA(LocalGraph *this,Index x)

{
  size_type sVar1;
  Index local_c [2];
  Index x_local;
  
  local_c[0] = x;
  sVar1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                    (&(this->super_LocalGraphBase).SSAIndexes,local_c);
  return sVar1 != 0;
}

Assistant:

bool LocalGraph::isSSA(Index x) { return SSAIndexes.count(x); }